

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cpp
# Opt level: O1

int __thiscall hwnet::Epoll::Add(Epoll *this,Ptr *channel,int flag)

{
  element_type *peVar1;
  int iVar2;
  int iVar3;
  undefined1 local_30 [8];
  epoll_event ev;
  
  peVar1 = (channel->super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_30._4_4_ = SUB84(peVar1,0);
  ev.events = (uint32_t)((ulong)peVar1 >> 0x20);
  local_30._1_3_ = 0;
  local_30[0] = (flag & 2U) != 0;
  if ((flag & 4U) != 0) {
    local_30._0_4_ = local_30._0_4_ | 4;
  }
  local_30._0_4_ = (flag & 0xfffffff8U) << 0x1c | local_30._0_4_ | 0x2018;
  iVar3 = this->epfd;
  iVar2 = (*peVar1->_vptr_Channel[1])();
  iVar3 = epoll_ctl(iVar3,1,iVar2,(epoll_event *)local_30);
  iVar2 = -1;
  if (iVar3 == 0) {
    ((channel->super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->events =
         local_30._0_4_;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int Epoll::Add(const Channel::Ptr &channel,int flag) {
	epoll_event ev = {0};
	ev.data.ptr = channel.get();

	if(flag & Poller::Read) {
		ev.events |= EPOLLIN;
	}

	if(flag & Poller::Write) {
		ev.events |= EPOLLOUT;
	}

	int et = 0;
	if(flag & Poller::ET) {
		et = EPOLLET;
	}

	ev.events |= EPOLLERR | EPOLLHUP | EPOLLRDHUP | et;

	if(0 == epoll_ctl(this->epfd,EPOLL_CTL_ADD,channel->Fd(),&ev)){
		channel->events = ev.events;
		return 0;
	} else {
		return -1;
	}
}